

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles2::Functional::MatrixCaseUtils::writeVectorConstructor<2>
               (ostream *str,Vector<float,_2> *v)

{
  ostream *poVar1;
  int extraout_EDX;
  int extraout_EDX_00;
  int precision;
  int extraout_EDX_01;
  long lVar2;
  string local_50;
  
  poVar1 = std::operator<<(str,"vec");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,2);
  std::operator<<(poVar1,"(");
  lVar2 = 0;
  precision = extraout_EDX;
  do {
    if (lVar2 != 0) {
      if (lVar2 == 2) {
        std::operator<<(str,")");
        return;
      }
      std::operator<<(str,", ");
      precision = extraout_EDX_00;
    }
    de::floatToString_abi_cxx11_(&local_50,(de *)0x1,v->m_data[lVar2],precision);
    std::operator<<(str,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    lVar2 = lVar2 + 1;
    precision = extraout_EDX_01;
  } while( true );
}

Assistant:

void writeVectorConstructor (std::ostream& str, const tcu::Vector<float, Size>& v)
{
	str << "vec" << Size << "(";
	for (int ndx = 0; ndx < Size; ndx++)
	{
		if (ndx != 0)
			str << ", ";
		str << de::floatToString(v[ndx], 1);
	}
	str << ")";
}